

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O1

void __thiscall
soul::heart::ArrayElement::visitExpressions
          (ArrayElement *this,ExpressionVisitorFn fn,AccessType mode)

{
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> ref;
  pool_ref<soul::heart::Expression> local_30;
  AccessType local_24;
  
  pEVar1 = (this->dynamicIndex).object;
  if (pEVar1 != (Expression *)0x0) {
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
    local_30.object = (this->dynamicIndex).object;
    if (local_30.object == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","getAsPoolRef",0x3a);
    }
    local_24 = read;
    if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_002279e5;
    (*fn->_M_invoker)((_Any_data *)fn,&local_30,&local_24);
    (this->dynamicIndex).object = local_30.object;
  }
  pEVar1 = (this->parent).object;
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,(ulong)mode);
  local_30.object._0_4_ = mode;
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*fn->_M_invoker)((_Any_data *)fn,&this->parent,(AccessType *)&local_30);
    if ((ArrayElement *)(this->parent).object != this) {
      return;
    }
    throwInternalCompilerError("parent != *this","visitExpressions",0x22f);
  }
LAB_002279e5:
  std::__throw_bad_function_call();
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn, AccessType mode) override
        {
            if (isDynamic())
            {
                dynamicIndex->visitExpressions (fn, AccessType::read);
                auto ref = dynamicIndex.getAsPoolRef();
                fn (ref, AccessType::read);
                dynamicIndex = ref;
            }

            parent->visitExpressions (fn, mode);
            fn (parent, mode);
            SOUL_ASSERT (parent != *this);
        }